

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UCIAdapter.cpp
# Opt level: O2

void __thiscall senjo::UCIAdapter::~UCIAdapter(UCIAdapter *this)

{
  ~UCIAdapter(this);
  operator_delete(this);
  return;
}

Assistant:

UCIAdapter::~UCIAdapter()
{
  engine = NULL;
}